

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::buffer<wchar_t>::append<wchar_t>
          (buffer<wchar_t> *this,wchar_t *begin,wchar_t *end)

{
  _func_int ***ppp_Var1;
  type tVar2;
  wchar_t *in_RDX;
  wchar_t *in_RSI;
  long in_RDI;
  size_t new_size;
  size_t in_stack_ffffffffffffffb8;
  buffer<wchar_t> *this_00;
  
  this_00 = *(buffer<wchar_t> **)(in_RDI + 0x10);
  tVar2 = to_unsigned<long>((long)in_RDX - (long)in_RSI >> 2);
  ppp_Var1 = &this_00->_vptr_buffer;
  reserve(this_00,in_stack_ffffffffffffffb8);
  make_checked<wchar_t>(*(wchar_t **)(in_RDI + 8),*(size_t *)(in_RDI + 0x18));
  std::uninitialized_copy<wchar_t_const*,wchar_t*>(in_RDX,in_RSI,(wchar_t *)this_00);
  *(type *)(in_RDI + 0x10) = (long)ppp_Var1 + tVar2;
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  std::size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end, make_checked(ptr_, capacity_) + size_);
  size_ = new_size;
}